

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool __thiscall
QXmlStreamWriterPrivate::finishStartElement(QXmlStreamWriterPrivate *this,bool contents)

{
  ushort uVar1;
  QAnyStringView *this_00;
  qsizetype qVar2;
  ushort uVar3;
  byte in_SIL;
  QXmlStreamWriterPrivate *in_RDI;
  long in_FS_OFFSET;
  bool hadSomethingWritten;
  Tag tag;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  char *in_stack_fffffffffffffef8;
  int *str;
  QXmlStreamPrivateTagStack *in_stack_ffffffffffffff00;
  int local_98 [2];
  void *local_90;
  undefined1 local_88 [104];
  qsizetype local_20;
  int local_18;
  void *local_10;
  long local_8;
  size_t __n;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ushort *)&in_RDI->field_0x78;
  uVar3 = *(ushort *)&in_RDI->field_0x78 & 0xffef | (ushort)(in_SIL & 1) << 4;
  __n = (size_t)uVar3;
  *(ushort *)&in_RDI->field_0x78 = uVar3;
  if ((*(ushort *)&in_RDI->field_0x78 >> 1 & 1) != 0) {
    if ((*(ushort *)&in_RDI->field_0x78 >> 2 & 1) == 0) {
      str = local_98;
      this_00 = (QAnyStringView *)std::data<char_const,2ul>((char (*) [2])0x9ea063);
      QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x64cb9b);
      QAnyStringView::QAnyStringView<char,_true>
                (this_00,(char *)str,CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      write(in_RDI,local_98[0],local_90,__n);
    }
    else {
      std::data<char_const,3ul>((char (*) [3])"/>");
      QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])0x64cacf);
      QAnyStringView::QAnyStringView<char,_true>
                ((QAnyStringView *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      write(in_RDI,local_18,local_10,__n);
      memset(local_88,0xaa,0x70);
      QXmlStreamPrivateTagStack::tagStack_pop(in_stack_ffffffffffffff00);
      in_RDI->lastNamespaceDeclaration = local_20;
      *(ushort *)&in_RDI->field_0x78 = *(ushort *)&in_RDI->field_0x78 & 0xfff7;
    }
    *(ushort *)&in_RDI->field_0x78 = *(ushort *)&in_RDI->field_0x78 & 0xfffb;
    *(ushort *)&in_RDI->field_0x78 = *(ushort *)&in_RDI->field_0x78 & 0xfffd;
    qVar2 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::size
                      ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                       in_RDI);
    in_RDI->lastNamespaceDeclaration = qVar2;
    *(ushort *)&in_RDI->field_0x78 = *(ushort *)&in_RDI->field_0x78 & 0xfdff | 0x200;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (uVar1 >> 4 & 1) != 0;
}

Assistant:

bool QXmlStreamWriterPrivate::finishStartElement(bool contents)
{
    bool hadSomethingWritten = wroteSomething;
    wroteSomething = contents;
    if (!inStartElement)
        return hadSomethingWritten;

    if (inEmptyElement) {
        write("/>");
        QXmlStreamWriterPrivate::Tag tag = tagStack_pop();
        lastNamespaceDeclaration = tag.namespaceDeclarationsSize;
        lastWasStartElement = false;
    } else {
        write(">");
    }
    inStartElement = inEmptyElement = false;
    lastNamespaceDeclaration = namespaceDeclarations.size();
    didWriteAnyToken = true;
    return hadSomethingWritten;
}